

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O0

CURLcode cw_pause_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  _Bool _Var1;
  CURLcode CVar2;
  cw_pause_buf *pcVar3;
  cw_pause_ctx *local_80;
  cw_pause_ctx *local_78;
  byte local_69;
  cw_pause_buf *cwbuf;
  size_t nwritten;
  int wtype;
  _Bool decoding;
  size_t wlen;
  void *pvStack_40;
  CURLcode result;
  cw_pause_ctx *ctx;
  size_t blen_local;
  char *buf_local;
  Curl_cwriter *pCStack_20;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  pvStack_40 = writer->ctx;
  wlen._4_4_ = CURLE_OK;
  _wtype = (cw_pause_ctx *)0x0;
  ctx = (cw_pause_ctx *)blen;
  blen_local = (size_t)buf;
  buf_local._4_4_ = type;
  pCStack_20 = writer;
  writer_local = (Curl_cwriter *)data;
  nwritten._7_1_ = Curl_cwriter_is_content_decoding(data);
  if ((*(long *)((long)pvStack_40 + 0x20) != 0) &&
     (_Var1 = Curl_cwriter_is_paused((Curl_easy *)writer_local), !_Var1)) {
    CVar2 = cw_pause_flush((Curl_easy *)writer_local,pCStack_20);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    wlen._4_4_ = CURLE_OK;
  }
  while( true ) {
    local_69 = 0;
    if (*(long *)((long)pvStack_40 + 0x20) == 0) {
      _Var1 = Curl_cwriter_is_paused((Curl_easy *)writer_local);
      local_69 = _Var1 ^ 0xff;
    }
    if ((local_69 & 1) == 0) {
      while( true ) {
        cwbuf = (cw_pause_buf *)0x0;
        if (((*(long *)((long)pvStack_40 + 0x20) == 0) ||
            (*(uint *)(*(long *)((long)pvStack_40 + 0x20) + 0x48) != buf_local._4_4_)) ||
           ((buf_local._4_4_ & 1) == 0)) {
          pcVar3 = cw_pause_buf_create(buf_local._4_4_,(size_t)ctx);
          if (pcVar3 == (cw_pause_buf *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar3->next = *(cw_pause_buf **)((long)pvStack_40 + 0x20);
          *(cw_pause_buf **)((long)pvStack_40 + 0x20) = pcVar3;
          wlen._4_4_ = Curl_bufq_cwrite((bufq *)(*(long *)((long)pvStack_40 + 0x20) + 8),
                                        (char *)blen_local,(size_t)ctx,(size_t *)&cwbuf);
        }
        else {
          wlen._4_4_ = Curl_bufq_cwrite((bufq *)(*(long *)((long)pvStack_40 + 0x20) + 8),
                                        (char *)blen_local,(size_t)ctx,(size_t *)&cwbuf);
        }
        if ((((writer_local != (Curl_cwriter *)0x0) &&
             ((*(ulong *)((long)&writer_local[0x51].next + 4) >> 0x1e & 1) != 0)) &&
            ((writer_local[0x98].ctx == (void *)0x0 ||
             (0 < *(int *)((long)writer_local[0x98].ctx + 8))))) &&
           (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write((Curl_easy *)writer_local,
                         "[PAUSE] buffer %zu more bytes of type %x, total=%zu -> %d",cwbuf,
                         (ulong)buf_local._4_4_,
                         (long)&(_wtype->super).cwt + *(long *)((long)pvStack_40 + 0x28),
                         (ulong)wlen._4_4_);
        }
        if (wlen._4_4_ != CURLE_OK) break;
        blen_local = (long)&cwbuf->next + blen_local;
        ctx = (cw_pause_ctx *)((long)ctx - (long)cwbuf);
        *(long *)((long)pvStack_40 + 0x28) = (long)&cwbuf->next + *(long *)((long)pvStack_40 + 0x28)
        ;
        if (ctx == (cw_pause_ctx *)0x0) {
          return CURLE_OK;
        }
      }
      return wlen._4_4_;
    }
    nwritten._0_4_ = buf_local._4_4_;
    if (((nwritten._7_1_ & 1) == 0) || ((buf_local._4_4_ & 1) == 0)) {
      local_80 = ctx;
    }
    else {
      if (ctx < (cw_pause_ctx *)0x1000) {
        local_78 = ctx;
      }
      else {
        local_78 = (cw_pause_ctx *)0x1000;
      }
      local_80 = local_78;
    }
    _wtype = local_80;
    if (local_80 < ctx) {
      nwritten._0_4_ = buf_local._4_4_ & 0xffffff7f;
    }
    wlen._4_4_ = Curl_cwriter_write((Curl_easy *)writer_local,pCStack_20->next,(uint)nwritten,
                                    (char *)blen_local,(size_t)local_80);
    if ((((writer_local != (Curl_cwriter *)0x0) &&
         ((*(ulong *)((long)&writer_local[0x51].next + 4) >> 0x1e & 1) != 0)) &&
        ((writer_local[0x98].ctx == (void *)0x0 || (0 < *(int *)((long)writer_local[0x98].ctx + 8)))
        )) && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write((Curl_easy *)writer_local,"[PAUSE] writing %zu/%zu bytes of type %x -> %d",
                     _wtype,ctx,(ulong)(uint)nwritten,(ulong)wlen._4_4_);
    }
    if (wlen._4_4_ != CURLE_OK) break;
    blen_local = (long)&(_wtype->super).cwt + blen_local;
    ctx = (cw_pause_ctx *)((long)ctx - (long)_wtype);
    if (ctx == (cw_pause_ctx *)0x0) {
      return CURLE_OK;
    }
  }
  return wlen._4_4_;
}

Assistant:

static CURLcode cw_pause_write(struct Curl_easy *data,
                               struct Curl_cwriter *writer, int type,
                               const char *buf, size_t blen)
{
  struct cw_pause_ctx *ctx = writer->ctx;
  CURLcode result = CURLE_OK;
  size_t wlen = 0;
  bool decoding = Curl_cwriter_is_content_decoding(data);

  if(ctx->buf && !Curl_cwriter_is_paused(data)) {
    result = cw_pause_flush(data, writer);
    if(result)
      return result;
  }

  while(!ctx->buf && !Curl_cwriter_is_paused(data)) {
    int wtype = type;
    DEBUGASSERT(!ctx->buf);
    /* content decoding might blow up size considerably, write smaller
     * chunks to make pausing need buffer less. */
    wlen = (decoding && (type & CLIENTWRITE_BODY)) ?
           CURLMIN(blen, CW_PAUSE_DEC_WRITE_CHUNK) : blen;
    if(wlen < blen)
      wtype &= ~CLIENTWRITE_EOS;
    result = Curl_cwriter_write(data, writer->next, wtype, buf, wlen);
    CURL_TRC_WRITE(data, "[PAUSE] writing %zu/%zu bytes of type %x -> %d",
                   wlen, blen, wtype, result);
    if(result)
      return result;
    buf += wlen;
    blen -= wlen;
    if(!blen)
      return result;
  }

  do {
    size_t nwritten = 0;
    if(ctx->buf && (ctx->buf->type == type) && (type & CLIENTWRITE_BODY)) {
      /* same type and body, append to current buffer which has a soft
       * limit and should take everything up to OOM. */
      result = Curl_bufq_cwrite(&ctx->buf->b, buf, blen, &nwritten);
    }
    else {
      /* Need a new buf, type changed */
      struct cw_pause_buf *cwbuf = cw_pause_buf_create(type, blen);
      if(!cwbuf)
        return CURLE_OUT_OF_MEMORY;
      cwbuf->next = ctx->buf;
      ctx->buf = cwbuf;
      result = Curl_bufq_cwrite(&ctx->buf->b, buf, blen, &nwritten);
    }
    CURL_TRC_WRITE(data, "[PAUSE] buffer %zu more bytes of type %x, "
                   "total=%zu -> %d", nwritten, type, ctx->buf_total + wlen,
                   result);
    if(result)
      return result;
    buf += nwritten;
    blen -= nwritten;
    ctx->buf_total += nwritten;
  } while(blen);

  return result;
}